

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void __thiscall cilk_fiber::suspend_self_and_resume_other(cilk_fiber *this,cilk_fiber *other)

{
  bool bVar1;
  cilk_fiber_sysdep *this_00;
  cilk_fiber_sysdep *other_00;
  cilk_fiber *in_RSI;
  cilk_fiber *in_RDI;
  cilk_fiber_sysdep *self;
  
  dec_ref_count(in_RDI);
  inc_ref_count(in_RSI);
  assert_ref_count_at_least(in_RDI,1);
  (in_RSI->super_cilk_fiber_data).owner = (in_RDI->super_cilk_fiber_data).owner;
  (in_RDI->super_cilk_fiber_data).owner = (__cilkrts_worker *)0x0;
  bVar1 = is_resumable(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    set_resumable(in_RDI,true);
    this_00 = sysdep(in_RDI);
    other_00 = sysdep(in_RSI);
    cilk_fiber_sysdep::suspend_self_and_resume_other_sysdep(this_00,other_00);
    assert_ref_count_at_least(in_RDI,2);
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                ,0x39f,"!this->is_resumable()");
}

Assistant:

void cilk_fiber::suspend_self_and_resume_other(cilk_fiber* other)
{
#if FIBER_DEBUG >=1
    fprintf(stderr, "suspend_self_and_resume_other: self =%p, other=%p [owner=%p, resume_sf=%p]\n",
            this, other, other->owner, other->resume_sf);
#endif

    // Decrement my reference count (to suspend)
    // Increment other's count (to resume)
    // Suspended fiber should have a reference count of at least 1.  (It is not in a pool).
    this->dec_ref_count();
    other->inc_ref_count();
    this->assert_ref_count_at_least(1);

    // Pass along my owner.
    other->owner = this->owner;
    this->owner  = NULL;

    // Change this fiber to resumable.
    CILK_ASSERT(!this->is_resumable());
    this->set_resumable(true);

    // Normally, I'd assert other->is_resumable().  But this flag may
    // be false the first time we try to "resume" a fiber.
    cilk_fiber_sysdep* self = this->sysdep();
    self->suspend_self_and_resume_other_sysdep(other->sysdep());

    // HAVE RESUMED EXECUTION
    // When we come back here, we should have at least two references:
    // one for the fiber being allocated / out of a pool, and one for it being active.
    this->assert_ref_count_at_least(2);
}